

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O2

void __thiscall ImplDispatchTest::SetUp(ImplDispatchTest *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = CRYPTO_is_AESNI_capable();
  this->aesni_ = iVar1 != 0;
  iVar1 = CRYPTO_is_AVX_capable();
  if (iVar1 == 0) {
    bVar2 = false;
  }
  else {
    iVar1 = CRYPTO_is_MOVBE_capable();
    bVar2 = iVar1 != 0;
  }
  this->avx_movbe_ = bVar2;
  iVar1 = CRYPTO_is_SSSE3_capable();
  this->ssse3_ = iVar1 != 0;
  iVar1 = CRYPTO_is_VAES_capable();
  if (iVar1 == 0) {
LAB_002cc326:
    bVar2 = false;
  }
  else {
    iVar1 = CRYPTO_is_VPCLMULQDQ_capable();
    if (iVar1 == 0) goto LAB_002cc326;
    iVar1 = CRYPTO_is_AVX2_capable();
    bVar2 = iVar1 != 0;
  }
  this->vaes_ = bVar2;
  iVar1 = CRYPTO_is_AVX512BW_capable();
  if (iVar1 != 0) {
    iVar1 = CRYPTO_is_AVX512VL_capable();
    if (iVar1 != 0) {
      iVar1 = CRYPTO_is_BMI2_capable();
      bVar2 = iVar1 != 0;
      goto LAB_002cc34b;
    }
  }
  bVar2 = false;
LAB_002cc34b:
  this->avx512_ = bVar2;
  iVar1 = CRYPTO_cpu_avoid_zmm_registers();
  this->avoid_zmm_ = iVar1 != 0;
  this->is_x86_64_ = true;
  return;
}

Assistant:

void SetUp() override {
#if defined(OPENSSL_X86) || defined(OPENSSL_X86_64)
    aesni_ = CRYPTO_is_AESNI_capable();
    avx_movbe_ = CRYPTO_is_AVX_capable() && CRYPTO_is_MOVBE_capable();
    ssse3_ = CRYPTO_is_SSSE3_capable();
    vaes_ = CRYPTO_is_VAES_capable() && CRYPTO_is_VPCLMULQDQ_capable() &&
            CRYPTO_is_AVX2_capable();
    avx512_ = CRYPTO_is_AVX512BW_capable() && CRYPTO_is_AVX512VL_capable() &&
              CRYPTO_is_BMI2_capable();
    avoid_zmm_ = CRYPTO_cpu_avoid_zmm_registers();
    is_x86_64_ =
#if defined(OPENSSL_X86_64)
        true;
#else
        false;
#endif
#endif  // X86 || X86_64
  }